

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlXPathCompExprPtr xmlXPathTryStreamCompile(xmlXPathContextPtr ctxt,xmlChar *str)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  xmlChar *pxVar4;
  xmlChar **namespaces;
  long lVar5;
  xmlPatternPtr comp;
  char *extra;
  xmlDictPtr dict;
  
  pxVar4 = xmlStrchr(str,'[');
  if (pxVar4 != (xmlChar *)0x0) {
    return (xmlXPathCompExprPtr)0x0;
  }
  pxVar4 = xmlStrchr(str,'(');
  if (pxVar4 != (xmlChar *)0x0) {
    return (xmlXPathCompExprPtr)0x0;
  }
  pxVar4 = xmlStrchr(str,'@');
  if (pxVar4 != (xmlChar *)0x0) {
    return (xmlXPathCompExprPtr)0x0;
  }
  pxVar4 = xmlStrchr(str,':');
  if ((pxVar4 == (xmlChar *)0x0) ||
     (((ctxt != (xmlXPathContextPtr)0x0 && (ctxt->nsNr != 0)) && (pxVar4[1] != ':')))) {
    if (ctxt != (xmlXPathContextPtr)0x0) {
      dict = ctxt->dict;
      if (ctxt->nsNr < 1) {
        namespaces = (xmlChar **)0x0;
        goto LAB_001e084a;
      }
      namespaces = (xmlChar **)(*xmlMalloc)((ulong)(ctxt->nsNr * 2 + 2) << 3);
      if (namespaces != (xmlChar **)0x0) {
        iVar3 = ctxt->nsNr;
        if ((long)iVar3 < 1) {
          lVar5 = 0;
        }
        else {
          lVar5 = 0;
          do {
            lVar1 = *(long *)((long)ctxt->namespaces + lVar5 * 4);
            namespaces[lVar5] = *(xmlChar **)(lVar1 + 0x10);
            namespaces[lVar5 + 1] = *(xmlChar **)(lVar1 + 0x18);
            lVar5 = lVar5 + 2;
          } while ((long)iVar3 * 2 != lVar5);
        }
        namespaces[lVar5] = (xmlChar *)0x0;
        (namespaces + lVar5)[1] = (xmlChar *)0x0;
        goto LAB_001e084a;
      }
      extra = "allocating namespaces array\n";
LAB_001e08ba:
      xmlXPathErrMemory(ctxt,extra);
      goto LAB_001e08c2;
    }
    namespaces = (xmlChar **)0x0;
    dict = (xmlDictPtr)0x0;
LAB_001e084a:
    comp = xmlPatterncompile(str,dict,1,namespaces);
    if (namespaces != (xmlChar **)0x0) {
      (*xmlFree)(namespaces);
    }
    if ((comp == (xmlPatternPtr)0x0) || (iVar3 = xmlPatternStreamable(comp), iVar3 != 1)) {
      xmlFreePattern(comp);
      bVar2 = true;
      goto LAB_001e08c7;
    }
    str = (xmlChar *)xmlXPathNewCompExpr();
    if ((xmlXPathCompExprPtr)str == (xmlXPathCompExprPtr)0x0) {
      extra = "allocating streamable expression\n";
      goto LAB_001e08ba;
    }
    ((xmlXPathCompExprPtr)str)->stream = comp;
    ((xmlXPathCompExprPtr)str)->dict = dict;
    if (dict != (xmlDictPtr)0x0) {
      xmlDictReference(dict);
    }
  }
  else {
LAB_001e08c2:
    str = (xmlChar *)0x0;
  }
  bVar2 = false;
LAB_001e08c7:
  if (bVar2) {
    return (xmlXPathCompExprPtr)0x0;
  }
  return (xmlXPathCompExprPtr)str;
}

Assistant:

static xmlXPathCompExprPtr
xmlXPathTryStreamCompile(xmlXPathContextPtr ctxt, const xmlChar *str) {
    /*
     * Optimization: use streaming patterns when the XPath expression can
     * be compiled to a stream lookup
     */
    xmlPatternPtr stream;
    xmlXPathCompExprPtr comp;
    xmlDictPtr dict = NULL;
    const xmlChar **namespaces = NULL;
    xmlNsPtr ns;
    int i, j;

    if ((!xmlStrchr(str, '[')) && (!xmlStrchr(str, '(')) &&
        (!xmlStrchr(str, '@'))) {
	const xmlChar *tmp;

	/*
	 * We don't try to handle expressions using the verbose axis
	 * specifiers ("::"), just the simplified form at this point.
	 * Additionally, if there is no list of namespaces available and
	 *  there's a ":" in the expression, indicating a prefixed QName,
	 *  then we won't try to compile either. xmlPatterncompile() needs
	 *  to have a list of namespaces at compilation time in order to
	 *  compile prefixed name tests.
	 */
	tmp = xmlStrchr(str, ':');
	if ((tmp != NULL) &&
	    ((ctxt == NULL) || (ctxt->nsNr == 0) || (tmp[1] == ':')))
	    return(NULL);

	if (ctxt != NULL) {
	    dict = ctxt->dict;
	    if (ctxt->nsNr > 0) {
		namespaces = xmlMalloc(2 * (ctxt->nsNr + 1) * sizeof(xmlChar*));
		if (namespaces == NULL) {
		    xmlXPathErrMemory(ctxt, "allocating namespaces array\n");
		    return(NULL);
		}
		for (i = 0, j = 0; (j < ctxt->nsNr); j++) {
		    ns = ctxt->namespaces[j];
		    namespaces[i++] = ns->href;
		    namespaces[i++] = ns->prefix;
		}
		namespaces[i++] = NULL;
		namespaces[i] = NULL;
	    }
	}

	stream = xmlPatterncompile(str, dict, XML_PATTERN_XPATH, namespaces);
	if (namespaces != NULL) {
	    xmlFree((xmlChar **)namespaces);
	}
	if ((stream != NULL) && (xmlPatternStreamable(stream) == 1)) {
	    comp = xmlXPathNewCompExpr();
	    if (comp == NULL) {
		xmlXPathErrMemory(ctxt, "allocating streamable expression\n");
		return(NULL);
	    }
	    comp->stream = stream;
	    comp->dict = dict;
	    if (comp->dict)
		xmlDictReference(comp->dict);
	    return(comp);
	}
	xmlFreePattern(stream);
    }
    return(NULL);
}